

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cc
# Opt level: O2

String __thiscall
testing::PrintTestPartResultToString(testing *this,TestPartResult *test_part_result)

{
  Message *pMVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  String SVar3;
  Message local_38;
  String local_30;
  char *local_20;
  char *local_18;
  
  Message::Message(&local_38);
  internal::FormatFileLocation
            ((internal *)&local_30,(test_part_result->file_name_).c_str_,
             test_part_result->line_number_);
  pMVar1 = Message::operator<<(&local_38,&local_30);
  pMVar1 = Message::operator<<(pMVar1,(char (*) [2])0x1708c5);
  if ((ulong)test_part_result->type_ < 3) {
    local_18 = &DAT_0016fa04 + *(int *)(&DAT_0016fa04 + (ulong)test_part_result->type_ * 4);
  }
  else {
    local_18 = "Unknown result type";
  }
  pMVar1 = Message::operator<<(pMVar1,&local_18);
  local_20 = (test_part_result->message_).c_str_;
  Message::operator<<(pMVar1,&local_20);
  Message::GetString((Message *)this);
  internal::String::~String(&local_30);
  sVar2 = extraout_RDX;
  if (local_38.ss_ != (StrStream *)0x0) {
    (**(code **)(*(long *)local_38.ss_ + 8))();
    sVar2 = extraout_RDX_00;
  }
  SVar3.length_ = sVar2;
  SVar3.c_str_ = (char *)this;
  return SVar3;
}

Assistant:

static internal::String PrintTestPartResultToString(
    const TestPartResult& test_part_result) {
  return (Message()
          << internal::FormatFileLocation(test_part_result.file_name(),
                                          test_part_result.line_number())
          << " " << TestPartResultTypeToString(test_part_result.type())
          << test_part_result.message()).GetString();
}